

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetFilenameComponentCommand.cxx
# Opt level: O2

bool cmGetFilenameComponentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  cmValue cVar7;
  long lVar8;
  string *psVar9;
  char *extraout_RDX;
  uint i;
  uint uVar10;
  string_view value;
  string_view str;
  string_view value_00;
  string_view value_01;
  string program;
  string result;
  string filename;
  string storeArgs;
  string programArgs;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)pbVar1 -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"called with incorrect number of arguments",
               (allocator<char> *)&filename);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&result);
    cmSystemTools::s_FatalErrorOccurred = true;
    return false;
  }
  if ((((uVar6 != 0x60) && (bVar4 = std::operator==(pbVar1 + -1,"CACHE"), bVar4)) &&
      (cVar7 = cmMakefile::GetDefinition
                         (status->Makefile,
                          (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start), cVar7.Value != (string *)0x0)
      ) && (value._M_str = extraout_RDX, value._M_len = (size_t)((cVar7.Value)->_M_dataplus)._M_p,
           bVar4 = cmValue::IsNOTFOUND((cmValue *)(cVar7.Value)->_M_string_length,value), !bVar4)) {
    return true;
  }
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&filename,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 1));
  lVar8 = std::__cxx11::string::find((char *)&filename,0x65548b);
  uVar6 = 2;
  if (lVar8 != -1) {
    bVar4 = cmMakefile::PlatformIs64Bit(status->Makefile);
    cmSystemTools::ExpandRegistryValues(&filename,bVar4 + KeyWOW64_32);
    lVar8 = std::__cxx11::string::find((char *)&filename,0x641cf3);
    if (lVar8 != -1) {
      std::__cxx11::string::string
                ((string *)&storeArgs,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 1));
      cmSystemTools::ExpandRegistryValues(&storeArgs,KeyWOW64_64 - bVar4);
      lVar8 = std::__cxx11::string::find((char *)&storeArgs,0x641cf3);
      if (lVar8 == -1) {
        std::__cxx11::string::_M_assign((string *)&filename);
      }
      std::__cxx11::string::~string((string *)&storeArgs);
    }
  }
  storeArgs._M_dataplus._M_p = (pointer)&storeArgs.field_2;
  storeArgs._M_string_length = 0;
  programArgs._M_dataplus._M_p = (pointer)&programArgs.field_2;
  programArgs._M_string_length = 0;
  storeArgs.field_2._M_local_buf[0] = '\0';
  programArgs.field_2._M_local_buf[0] = '\0';
  bVar4 = std::operator==((args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 2,"DIRECTORY");
  if ((bVar4) ||
     (bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH"), bVar4)) {
    cmsys::SystemTools::GetFilenamePath(&program,&filename);
LAB_002356bf:
    std::__cxx11::string::operator=((string *)&result,(string *)&program);
LAB_002356d2:
    std::__cxx11::string::~string((string *)&program);
  }
  else {
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"NAME");
    if (bVar4) {
      cmsys::SystemTools::GetFilenameName(&program,&filename);
      goto LAB_002356bf;
    }
    bVar4 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"PROGRAM");
    if (!bVar4) {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"EXT");
      if (bVar4) {
        cmsys::SystemTools::GetFilenameExtension(&program,&filename);
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 2,"NAME_WE");
        if (bVar4) {
          cmsys::SystemTools::GetFilenameWithoutExtension(&program,&filename);
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 2,"LAST_EXT");
          if (bVar4) {
            cmsys::SystemTools::GetFilenameLastExtension(&program,&filename);
          }
          else {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 2,"NAME_WLE");
            if (!bVar4) {
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,"ABSOLUTE");
              if ((!bVar4) &&
                 (bVar4 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH")
                 , !bVar4)) {
                std::operator+(&program,"unknown component ",
                               (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                cmSystemTools::s_FatalErrorOccurred = true;
                std::__cxx11::string::~string((string *)&program);
                bVar4 = false;
                goto LAB_002357d2;
              }
              psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
              std::__cxx11::string::string((string *)&program,(string *)psVar9);
              uVar6 = 3;
              while( true ) {
                uVar10 = (uint)uVar6;
                pbVar1 = (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)
                    <= uVar6) break;
                bVar4 = std::operator==(pbVar1 + uVar6,"BASE_DIR");
                if ((bVar4) &&
                   (uVar10 = uVar10 + 1,
                   (ulong)uVar10 <
                   (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5))) {
                  std::__cxx11::string::_M_assign((string *)&program);
                }
                uVar6 = (ulong)(uVar10 + 1);
              }
              cmsys::SystemTools::CollapseFullPath(&local_68,&filename,&program);
              std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,"REALPATH");
              if (bVar4) {
                cmsys::SystemTools::GetRealPath(&local_68,&result,(string *)0x0);
                std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
                std::__cxx11::string::~string((string *)&local_68);
              }
              goto LAB_002356d2;
            }
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&program,&filename);
          }
        }
      }
      goto LAB_002356bf;
    }
    while( true ) {
      uVar10 = (uint)uVar6;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
      break;
      bVar4 = std::operator==(pbVar1 + uVar6,"PROGRAM_ARGS");
      if ((bVar4) &&
         (uVar10 = uVar10 + 1,
         (ulong)uVar10 <
         (ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5))) {
        std::__cxx11::string::_M_assign((string *)&storeArgs);
      }
      uVar6 = (ulong)(uVar10 + 1);
    }
    str._M_str = filename._M_dataplus._M_p;
    str._M_len = filename._M_string_length;
    cmTrimWhitespace_abi_cxx11_(&program,str);
    sVar3 = program._M_string_length;
    std::__cxx11::string::~string((string *)&program);
    if (sVar3 != 0) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (&program,&filename,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_68,false);
      std::__cxx11::string::operator=((string *)&result,(string *)&program);
      std::__cxx11::string::~string((string *)&program);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_68);
    }
    if (result._M_string_length == 0) {
      program._M_dataplus._M_p = (pointer)&program.field_2;
      program._M_string_length = 0;
      program.field_2._M_local_buf[0] = '\0';
      bVar4 = cmSystemTools::SplitProgramFromArgs(&filename,&program,&programArgs);
      if (bVar4) {
        bVar4 = cmsys::SystemTools::FileExists(&program);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&result);
        }
        else {
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmsys::SystemTools::FindProgram(&local_68,&program,&local_48,false);
          std::__cxx11::string::operator=((string *)&result,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      if (result._M_string_length == 0) {
        programArgs._M_string_length = 0;
        *programArgs._M_dataplus._M_p = '\0';
      }
      goto LAB_002356d2;
    }
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)((long)pbVar1 -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) < 0x61) ||
     (bVar4 = std::operator==(pbVar1 + -1,"CACHE"), !bVar4)) {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      value_00._M_str = programArgs._M_dataplus._M_p;
      value_00._M_len = programArgs._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,&storeArgs,value_00);
    }
    bVar4 = true;
    value_01._M_str = result._M_dataplus._M_p;
    value_01._M_len = result._M_string_length;
    cmMakefile::AddDefinition
              (status->Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,value_01);
  }
  else {
    if ((programArgs._M_string_length != 0) && (storeArgs._M_string_length != 0)) {
      pcVar2 = status->Makefile;
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2,"PATH");
      cmMakefile::AddCacheDefinition
                (pcVar2,&storeArgs,programArgs._M_dataplus._M_p,"",bVar4 ^ STRING,false);
    }
    pcVar2 = status->Makefile;
    psVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar5 = std::operator==(psVar9 + 2,"PATH");
    bVar4 = true;
    cmMakefile::AddCacheDefinition(pcVar2,psVar9,result._M_dataplus._M_p,"",bVar5 ^ STRING,false);
  }
LAB_002357d2:
  std::__cxx11::string::~string((string *)&programArgs);
  std::__cxx11::string::~string((string *)&storeArgs);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&result);
  return bVar4;
}

Assistant:

bool cmGetFilenameComponentCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Check and see if the value has been stored in the cache
  // already, if so use that value
  if (args.size() >= 4 && args.back() == "CACHE") {
    cmValue cacheValue = status.GetMakefile().GetDefinition(args.front());
    if (cacheValue && !cmIsNOTFOUND(*cacheValue)) {
      return true;
    }
  }

  std::string result;
  std::string filename = args[1];
  if (filename.find("[HKEY") != std::string::npos) {
    // Check the registry as the target application would view it.
    cmSystemTools::KeyWOW64 view = cmSystemTools::KeyWOW64_32;
    cmSystemTools::KeyWOW64 other_view = cmSystemTools::KeyWOW64_64;
    if (status.GetMakefile().PlatformIs64Bit()) {
      view = cmSystemTools::KeyWOW64_64;
      other_view = cmSystemTools::KeyWOW64_32;
    }
    cmSystemTools::ExpandRegistryValues(filename, view);
    if (filename.find("/registry") != std::string::npos) {
      std::string other = args[1];
      cmSystemTools::ExpandRegistryValues(other, other_view);
      if (other.find("/registry") == std::string::npos) {
        filename = other;
      }
    }
  }
  std::string storeArgs;
  std::string programArgs;
  if (args[2] == "DIRECTORY" || args[2] == "PATH") {
    result = cmSystemTools::GetFilenamePath(filename);
  } else if (args[2] == "NAME") {
    result = cmSystemTools::GetFilenameName(filename);
  } else if (args[2] == "PROGRAM") {
    for (unsigned int i = 2; i < args.size(); ++i) {
      if (args[i] == "PROGRAM_ARGS") {
        i++;
        if (i < args.size()) {
          storeArgs = args[i];
        }
      }
    }

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmTrimWhitespace(filename).empty()) {
      result = cmSystemTools::FindProgram(filename);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (result.empty()) {
      std::string program;
      if (cmSystemTools::SplitProgramFromArgs(filename, program,
                                              programArgs)) {
        if (cmSystemTools::FileExists(program)) {
          result = program;
        } else {
          result = cmSystemTools::FindProgram(program);
        }
      }
      if (result.empty()) {
        programArgs.clear();
      }
    }
  } else if (args[2] == "EXT") {
    result = cmSystemTools::GetFilenameExtension(filename);
  } else if (args[2] == "NAME_WE") {
    result = cmSystemTools::GetFilenameWithoutExtension(filename);
  } else if (args[2] == "LAST_EXT") {
    result = cmSystemTools::GetFilenameLastExtension(filename);
  } else if (args[2] == "NAME_WLE") {
    result = cmSystemTools::GetFilenameWithoutLastExtension(filename);
  } else if (args[2] == "ABSOLUTE" || args[2] == "REALPATH") {
    // If the path given is relative, evaluate it relative to the
    // current source directory unless the user passes a different
    // base directory.
    std::string baseDir = status.GetMakefile().GetCurrentSourceDirectory();
    for (unsigned int i = 3; i < args.size(); ++i) {
      if (args[i] == "BASE_DIR") {
        ++i;
        if (i < args.size()) {
          baseDir = args[i];
        }
      }
    }
    // Collapse the path to its simplest form.
    result = cmSystemTools::CollapseFullPath(filename, baseDir);
    if (args[2] == "REALPATH") {
      // Resolve symlinks if possible
      result = cmSystemTools::GetRealPath(result);
    }
  } else {
    std::string err = "unknown component " + args[2];
    status.SetError(err);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (args.size() >= 4 && args.back() == "CACHE") {
    if (!programArgs.empty() && !storeArgs.empty()) {
      status.GetMakefile().AddCacheDefinition(
        storeArgs, programArgs, "",
        args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
    }
    status.GetMakefile().AddCacheDefinition(
      args.front(), result, "",
      args[2] == "PATH" ? cmStateEnums::FILEPATH : cmStateEnums::STRING);
  } else {
    if (!programArgs.empty() && !storeArgs.empty()) {
      status.GetMakefile().AddDefinition(storeArgs, programArgs);
    }
    status.GetMakefile().AddDefinition(args.front(), result);
  }

  return true;
}